

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O2

void __thiscall OjaNewton::update_A(OjaNewton *this)

{
  float *pfVar1;
  long lVar2;
  int j;
  long lVar3;
  long lVar4;
  long lVar5;
  int j_2;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int i;
  long lVar10;
  bool bVar11;
  float temp;
  float fVar12;
  float fVar13;
  
  lVar9 = 0;
  lVar2 = 1;
  lVar7 = 2;
  for (lVar10 = lVar2; lVar4 = lVar2, lVar10 <= this->m; lVar10 = lVar10 + 1) {
    for (; lVar3 = lVar2, lVar4 != lVar10; lVar4 = lVar4 + 1) {
      this->zv[lVar4] = 0.0;
      for (lVar3 = 0; lVar10 != lVar3; lVar3 = lVar3 + 1) {
        this->zv[lVar4] = this->A[lVar10][lVar3 + 1] * this->K[lVar3 + 1][lVar4] + this->zv[lVar4];
      }
    }
    for (; lVar4 = 2, lVar5 = lVar9, lVar6 = lVar2, lVar3 != lVar10; lVar3 = lVar3 + 1) {
      this->vv[lVar3] = 0.0;
      for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
        this->vv[lVar3] = this->A[lVar3][lVar4 + 1] * this->zv[lVar4 + 1] + this->vv[lVar3];
      }
    }
    for (; lVar3 = lVar4, lVar8 = lVar5, lVar6 != lVar10; lVar6 = lVar6 + 1) {
      while (bVar11 = lVar8 != 0, lVar8 = lVar8 + -1, bVar11) {
        pfVar1 = this->A[lVar10];
        pfVar1[lVar6] =
             pfVar1[lVar6] -
             *(float *)((long)this->vv + lVar3 * 2) *
             *(float *)(*(long *)((long)this->A + lVar3 * 4) + lVar6 * 4);
        lVar3 = lVar3 + 2;
      }
      lVar4 = lVar4 + 2;
      lVar5 = lVar5 + -1;
    }
    fVar12 = 0.0;
    for (lVar4 = lVar2; lVar4 != lVar7; lVar4 = lVar4 + 1) {
      fVar13 = 0.0;
      for (lVar3 = 0; lVar10 != lVar3; lVar3 = lVar3 + 1) {
        fVar13 = fVar13 + this->K[lVar4][lVar3 + 1] * this->A[lVar10][lVar3 + 1];
      }
      fVar12 = fVar12 + fVar13 * this->A[lVar10][lVar4];
    }
    if (fVar12 < 0.0) {
      fVar12 = sqrtf(fVar12);
    }
    else {
      fVar12 = SQRT(fVar12);
    }
    for (lVar4 = 0; lVar10 != lVar4; lVar4 = lVar4 + 1) {
      this->A[lVar10][lVar4 + 1] = this->A[lVar10][lVar4 + 1] / fVar12;
    }
    lVar7 = lVar7 + 1;
    lVar9 = lVar9 + 1;
  }
  return;
}

Assistant:

void update_A()
  {
    for (int i = 1; i <= m; i++)
    {
      for (int j = 1; j < i; j++)
      {
        zv[j] = 0;
        for (int k = 1; k <= i; k++)
        {
          zv[j] += A[i][k] * K[k][j];
        }
      }

      for (int j = 1; j < i; j++)
      {
        vv[j] = 0;
        for (int k = 1; k <= j; k++)
        {
          vv[j] += A[j][k] * zv[k];
        }
      }

      for (int j = 1; j < i; j++)
      {
        for (int k = j; k < i; k++)
        {
          A[i][j] -= vv[k] * A[k][j];
        }
      }

      float norm = 0;
      for (int j = 1; j <= i; j++)
      {
        float temp = 0;
        for (int k = 1; k <= i; k++)
        {
          temp += K[j][k] * A[i][k];
        }
        norm += A[i][j] * temp;
      }
      norm = sqrtf(norm);

      for (int j = 1; j <= i; j++)
      {
        A[i][j] /= norm;
      }
    }
  }